

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbkdf2.hpp
# Opt level: O0

void __thiscall
crypto::hmac<crypto::iterated_hash<crypto::sha256_transform>_>::finalize
          (hmac<crypto::iterated_hash<crypto::sha256_transform>_> *this,hash_word *ostate,char *mac)

{
  EVP_PKEY_CTX *in_RSI;
  iterated_hash<crypto::sha256_transform> outer;
  char buffer [32];
  char *in_stack_ffffffffffffff68;
  iterated_hash<crypto::sha256_transform> *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  iterated_hash<crypto::sha256_transform> *in_stack_ffffffffffffff90;
  
  iterated_hash<crypto::sha256_transform>::finalize
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  iterated_hash<crypto::sha256_transform>::init
            ((iterated_hash<crypto::sha256_transform> *)&stack0xffffffffffffff60,in_RSI);
  iterated_hash<crypto::sha256_transform>::update
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  iterated_hash<crypto::sha256_transform>::finalize
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  return;
}

Assistant:

void finalize(const state_t ostate, char mac[hash_size]) {
		
		char buffer[hash_size];
		inner.finalize(buffer);
		
		T outer;
		outer.init(ostate, 1);
		outer.update(buffer, hash_size);
		outer.finalize(mac);
		
	}